

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.cpp
# Opt level: O1

void __thiscall SupercellTest_TwoD2_Test::~SupercellTest_TwoD2_Test(SupercellTest_TwoD2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SupercellTest, TwoD2) {
  span_t span(2, 2);
  span << 4, -1,
          1, 3;
  supercell supercell(span);
  offset_t offset(2);

  EXPECT_EQ(13, supercell.num_cells());
  
  // within_supercell
  offset << 0, 0; EXPECT_TRUE(supercell.within_supercell(offset));
  offset << 0, 1; EXPECT_TRUE(supercell.within_supercell(offset));
  offset << 3, 1; EXPECT_TRUE(supercell.within_supercell(offset));
  offset << 0, 2; EXPECT_TRUE(supercell.within_supercell(offset));
  offset << 3, 2; EXPECT_TRUE(supercell.within_supercell(offset));
  offset << 0, 3; EXPECT_TRUE(supercell.within_supercell(offset));
  offset << 3, 3; EXPECT_TRUE(supercell.within_supercell(offset));
  offset << 0, -1; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << -1, 0; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << 1, 0; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << -1, 1; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << 4, 1; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << -1, 2; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << 4, 2; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << -1, 3; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << 4, 3; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << 0, 4; EXPECT_FALSE(supercell.within_supercell(offset));
  offset << 3, 4; EXPECT_FALSE(supercell.within_supercell(offset));

  check(supercell);

  std::size_t source, target;
  offset_t crossing(2), crossing_r(2);
  source = 0; offset << 1, 0; target = 9; crossing << 0, -1;
  EXPECT_EQ(std::make_pair(target, crossing), supercell.add_offset(source, offset));
  source = 4; offset << -1, -1; target = 10; crossing << 0, -1;
  EXPECT_EQ(std::make_pair(target, crossing), supercell.add_offset(source, offset));
  source = 1; offset << 4, 0; target = 0; crossing << 1, 0;
  EXPECT_EQ(std::make_pair(target, crossing), supercell.add_offset(source, offset));
  source = 7; offset << 3, 1; target = 6; crossing << 1, 0;
  EXPECT_EQ(std::make_pair(target, crossing), supercell.add_offset(source, offset));
  source = 7; offset << 1, 3; target = 1; crossing << 1, 1;
  EXPECT_EQ(std::make_pair(target, crossing), supercell.add_offset(source, offset));
}